

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

void print_by_lines(char *message,char *element_name)

{
  char *local_20;
  char *next_line_start;
  char *element_name_local;
  char *message_local;
  
  if ((message != (char *)0x0) && (*message != '\0')) {
    printf("\t\t\t<%s><![CDATA[",element_name);
    local_20 = pcut_str_find_char(message,'\n');
    element_name_local = message;
    while (local_20 != (char *)0x0) {
      *local_20 = '\0';
      printf("%s\n",element_name_local);
      element_name_local = local_20 + 1;
      local_20 = pcut_str_find_char(element_name_local,'\n');
    }
    if (*element_name_local != '\0') {
      printf("%s\n",element_name_local);
    }
    printf("]]></%s>\n",element_name);
  }
  return;
}

Assistant:

static void print_by_lines(const char *message, const char *element_name) {
	char *next_line_start;

	if ((message == NULL) || (message[0] == 0)) {
		return;
	}

	printf("\t\t\t<%s><![CDATA[", element_name);

	next_line_start = pcut_str_find_char(message, '\n');
	while (next_line_start != NULL) {
		next_line_start[0] = 0;
		printf("%s\n", message);
		message = next_line_start + 1;
		next_line_start = pcut_str_find_char(message, '\n');
	}
	if (message[0] != 0) {
		printf("%s\n", message);
	}

	printf("]]></%s>\n", element_name);
}